

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRestruct.c
# Opt level: O2

Dec_Edge_t
Abc_NodeEvaluateDsd_rec
          (Dec_Graph_t *pGraph,Abc_ManRst_t *pManRst,Dsd_Node_t *pNodeDsd,int Required,
          int nNodesSaved,int *pnNodesAdded)

{
  void *pvVar1;
  void *pvVar2;
  Dec_Node_t *pDVar3;
  int *piVar4;
  Dsd_Type_t DVar5;
  int iVar6;
  int iVar7;
  Dec_Edge_t DVar8;
  uint uVar9;
  uint uVar10;
  Dec_Edge_t DVar11;
  DdNode *pDVar12;
  Vec_Int_t *vEdges;
  Dsd_Node_t *pNodeDsd_00;
  Abc_Obj_t *pAVar13;
  DdNode *n;
  DdNode *n_00;
  DdNode *n_01;
  Abc_Obj_t *pAVar14;
  uint uVar15;
  uint uVar16;
  Dsd_Node_t *p;
  ulong uVar17;
  Abc_Aig_t *pAVar18;
  uint uVar19;
  Dec_Edge_t DVar20;
  ulong uVar21;
  bool bVar22;
  bool bVar23;
  int Type;
  Abc_Obj_t *local_98;
  int local_90;
  int local_8c;
  Abc_Obj_t *local_88;
  Dec_Edge_t local_7c;
  Abc_Obj_t *local_78;
  Dsd_Node_t *local_70;
  Abc_Obj_t *local_68;
  long local_60;
  long local_58;
  int *local_50;
  Vec_Int_t *local_48;
  Dec_Edge_t local_3c;
  long local_38;
  
  p = (Dsd_Node_t *)((ulong)pNodeDsd & 0xfffffffffffffffe);
  local_8c = Required;
  local_70 = pNodeDsd;
  DVar5 = Dsd_NodeReadType(p);
  if (DVar5 == DSD_NODE_BUF) {
    pDVar12 = Dsd_NodeReadFunc(p);
    if ((int)pDVar12->index < pGraph->nLeaves) {
      return (Dec_Edge_t)(((uint)local_70 & 1) + (pDVar12->index & 0x3fffffff) * 2);
    }
    __assert_fail("Index < Dec_GraphLeaveNum(pGraph)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcRestruct.c"
                  ,0x261,
                  "Dec_Edge_t Abc_NodeEvaluateDsd_rec(Dec_Graph_t *, Abc_ManRst_t *, Dsd_Node_t *, int, int, int *)"
                 );
  }
  if (2 < DVar5 - DSD_NODE_OR) {
    __assert_fail("DecType == DSD_NODE_OR || DecType == DSD_NODE_EXOR || DecType == DSD_NODE_PRIME",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcRestruct.c"
                  ,0x265,
                  "Dec_Edge_t Abc_NodeEvaluateDsd_rec(Dec_Graph_t *, Abc_ManRst_t *, Dsd_Node_t *, int, int, int *)"
                 );
  }
  iVar6 = Dsd_NodeReadDecsNum(p);
  vEdges = Vec_IntAlloc(iVar6);
  for (iVar6 = 0; iVar7 = Dsd_NodeReadDecsNum(p), iVar6 < iVar7; iVar6 = iVar6 + 1) {
    pNodeDsd_00 = Dsd_NodeReadDec(p,iVar6);
    DVar8 = Abc_NodeEvaluateDsd_rec(pGraph,pManRst,pNodeDsd_00,local_8c,nNodesSaved,pnNodesAdded);
    if (((uint)DVar8 & 0x7ffffffe) == 0xfac) goto LAB_00274de6;
    if (DVar5 == DSD_NODE_PRIME) {
      Vec_IntPush(vEdges,(int)DVar8);
    }
    else {
      Abc_NodeEdgeDsdPushOrdered(pGraph,vEdges,(int)DVar8);
    }
  }
  local_90 = nNodesSaved;
  local_50 = pnNodesAdded;
  local_48 = vEdges;
  if (DVar5 == DSD_NODE_EXOR) {
    iVar6 = vEdges->nSize;
    if (iVar6 < 2) {
      __assert_fail("Vec_IntSize(vEdges) > 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcRestruct.c"
                    ,0x2b5,
                    "Dec_Edge_t Abc_NodeEvaluateDsd_rec(Dec_Graph_t *, Abc_ManRst_t *, Dsd_Node_t *, int, int, int *)"
                   );
    }
    while (1 < iVar6) {
      if (iVar6 != 2) {
        Abc_NodeEdgeDsdPermute(pGraph,pManRst,vEdges,1);
      }
      uVar9 = Vec_IntPop(vEdges);
      DVar11 = (Dec_Edge_t)(uVar9 & 0x7fffffff);
      uVar10 = Vec_IntPop(vEdges);
      DVar8 = (Dec_Edge_t)(uVar10 & 0x7fffffff);
      local_98 = (Abc_Obj_t *)((ulong)((uint)DVar11 >> 1) * 0x18);
      pvVar1 = pGraph->pNodes[(uint)DVar11 >> 1].field_2.pFunc;
      local_58 = (ulong)((uint)DVar8 >> 1) * 0x18;
      pvVar2 = pGraph->pNodes[(uint)DVar8 >> 1].field_2.pFunc;
      pAVar13 = (Abc_Obj_t *)((ulong)(uVar9 & 1) ^ (ulong)pvVar1);
      if (pvVar1 == (void *)0x0) {
        pAVar13 = (Abc_Obj_t *)0x0;
      }
      local_88 = (Abc_Obj_t *)((ulong)(uVar10 & 1) ^ (ulong)pvVar2);
      if (pvVar2 == (void *)0x0) {
        local_88 = (Abc_Obj_t *)0x0;
      }
      Type = 0;
      local_60 = CONCAT71(local_60._1_7_,local_88 != (Abc_Obj_t *)0x0 && pAVar13 != (Abc_Obj_t *)0x0
                         );
      if (local_88 != (Abc_Obj_t *)0x0 && pAVar13 != (Abc_Obj_t *)0x0) {
        pAVar14 = Abc_AigXorLookup((Abc_Aig_t *)pManRst->pNtk->pManFunc,pAVar13,local_88,&Type);
        if (Type == 0) goto LAB_00274648;
        DVar20 = Dec_GraphAddNodeAnd(pGraph,DVar11,DVar8);
        DVar8 = Dec_GraphAddNodeAnd(pGraph,(Dec_Edge_t)((uint)DVar11 ^ 1),
                                    (Dec_Edge_t)((uint)DVar8 ^ 1));
        DVar8 = Dec_GraphAddNodeOr(pGraph,DVar20,DVar8);
        DVar8 = (Dec_Edge_t)((uint)DVar8 ^ 1);
      }
      else {
        pAVar14 = (Abc_Obj_t *)0x0;
LAB_00274648:
        DVar20 = Dec_GraphAddNodeAnd(pGraph,(Dec_Edge_t)((uint)DVar11 ^ 1),DVar8);
        DVar8 = Dec_GraphAddNodeAnd(pGraph,DVar11,(Dec_Edge_t)((uint)DVar8 ^ 1));
        DVar8 = Dec_GraphAddNodeOr(pGraph,DVar20,DVar8);
      }
      vEdges = local_48;
      piVar4 = local_50;
      pDVar3 = pGraph->pNodes;
      uVar10 = *(uint *)(&pDVar3->field_0x10 + (long)local_98) & 0x3fff;
      uVar9 = *(uint *)(&pDVar3->field_0x10 + local_58) & 0x3fff;
      if (uVar9 < uVar10) {
        uVar9 = uVar10;
      }
      uVar10 = (uint)DVar8 >> 1;
      *(uint *)&pDVar3[uVar10].field_0x10 =
           *(uint *)&pDVar3[uVar10].field_0x10 & 0xffffc000 | uVar9 + 2 & 0x3fff;
      if (pAVar14 == (Abc_Obj_t *)0x0) {
LAB_00274729:
        iVar6 = *piVar4;
        *piVar4 = iVar6 + 1;
        if ((char)local_60 == '\0') {
          iVar6 = iVar6 + 3;
LAB_002747f5:
          *piVar4 = iVar6;
        }
        else {
          pAVar18 = (Abc_Aig_t *)pManRst->pNtk->pManFunc;
          if (Type == 0) {
            pAVar14 = Abc_AigAndLookup(pAVar18,pAVar13,(Abc_Obj_t *)((ulong)local_88 ^ 1));
            if ((pAVar14 == (Abc_Obj_t *)0x0) ||
               (iVar6 = Abc_NodeIsTravIdCurrent((Abc_Obj_t *)((ulong)pAVar14 & 0xfffffffffffffffe)),
               iVar6 != 0)) {
              *piVar4 = *piVar4 + 1;
            }
            pAVar18 = (Abc_Aig_t *)pManRst->pNtk->pManFunc;
            pAVar13 = (Abc_Obj_t *)((ulong)pAVar13 ^ 1);
          }
          else {
            pAVar14 = Abc_AigAndLookup(pAVar18,(Abc_Obj_t *)((ulong)pAVar13 ^ 1),
                                       (Abc_Obj_t *)((ulong)local_88 ^ 1));
            if ((pAVar14 == (Abc_Obj_t *)0x0) ||
               (iVar6 = Abc_NodeIsTravIdCurrent((Abc_Obj_t *)((ulong)pAVar14 & 0xfffffffffffffffe)),
               iVar6 != 0)) {
              *piVar4 = *piVar4 + 1;
            }
            pAVar18 = (Abc_Aig_t *)pManRst->pNtk->pManFunc;
          }
          pAVar13 = Abc_AigAndLookup(pAVar18,pAVar13,local_88);
          if ((pAVar13 == (Abc_Obj_t *)0x0) ||
             (iVar6 = Abc_NodeIsTravIdCurrent((Abc_Obj_t *)((ulong)pAVar13 & 0xfffffffffffffffe)),
             iVar6 != 0)) {
            iVar6 = *piVar4 + 1;
            goto LAB_002747f5;
          }
        }
        if (local_90 < *piVar4) goto LAB_00274de6;
      }
      else {
        pGraph->pNodes[uVar10].field_2.pFunc = (void *)((ulong)((uint)DVar8 & 1) ^ (ulong)pAVar14);
        if ((local_8c != 1000000000) &&
           ((*(uint *)&pGraph->pNodes[uVar10].field_0x10 & 0x3fff) !=
            *(uint *)(((ulong)pAVar14 & 0xfffffffffffffffe) + 0x14) >> 0xc)) {
          __assert_fail("Required == ABC_INFINITY || Level3 == (int)Abc_ObjRegular(pNode3)->Level",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcRestruct.c"
                        ,0x2d2,
                        "Dec_Edge_t Abc_NodeEvaluateDsd_rec(Dec_Graph_t *, Abc_ManRst_t *, Dsd_Node_t *, int, int, int *)"
                       );
        }
        iVar6 = Abc_NodeIsTravIdCurrent((Abc_Obj_t *)((ulong)pAVar14 & 0xfffffffffffffffe));
        if (iVar6 != 0) goto LAB_00274729;
      }
      Abc_NodeEdgeDsdPushOrdered(pGraph,vEdges,(int)DVar8);
      iVar6 = vEdges->nSize;
    }
  }
  else {
    if (DVar5 != DSD_NODE_OR) {
      if (DVar5 != DSD_NODE_PRIME) goto LAB_00274de6;
      n = Dsd_TreeGetPrimeFunction(pManRst->dd,p);
      Cudd_Ref(n);
      pDVar12 = *pManRst->dd->vars;
      n_00 = Cudd_Cofactor(pManRst->dd,n,(DdNode *)((ulong)pDVar12 ^ 1));
      Cudd_Ref(n_00);
      n_01 = Cudd_Cofactor(pManRst->dd,n,pDVar12);
      Cudd_Ref(n_01);
      iVar6 = Extra_bddIsVar(n_00);
      if ((iVar6 == 0) || (iVar6 = Extra_bddIsVar(n_01), iVar6 == 0)) {
        Cudd_RecursiveDeref(pManRst->dd,n_00);
        Cudd_RecursiveDeref(pManRst->dd,n_01);
        pDVar12 = pManRst->dd->vars[1];
        n_00 = Cudd_Cofactor(pManRst->dd,n,(DdNode *)((ulong)pDVar12 ^ 1));
        Cudd_Ref(n_00);
        n_01 = Cudd_Cofactor(pManRst->dd,n,pDVar12);
        Cudd_Ref(n_01);
        iVar6 = Extra_bddIsVar(n_00);
        if ((iVar6 == 0) || (iVar6 = Extra_bddIsVar(n_01), iVar6 == 0)) {
          Cudd_RecursiveDeref(pManRst->dd,n_00);
          Cudd_RecursiveDeref(pManRst->dd,n_01);
          pDVar12 = pManRst->dd->vars[2];
          n_00 = Cudd_Cofactor(pManRst->dd,n,(DdNode *)((ulong)pDVar12 ^ 1));
          Cudd_Ref(n_00);
          n_01 = Cudd_Cofactor(pManRst->dd,n,pDVar12);
          Cudd_Ref(n_01);
          iVar6 = Extra_bddIsVar(n_00);
          if ((iVar6 == 0) || (iVar6 = Extra_bddIsVar(n_01), iVar6 == 0)) {
            Cudd_RecursiveDeref(pManRst->dd,n_00);
            Cudd_RecursiveDeref(pManRst->dd,n_01);
            Cudd_RecursiveDeref(pManRst->dd,n);
            goto LAB_00274de6;
          }
        }
      }
      Cudd_RecursiveDeref(pManRst->dd,n);
      uVar9 = Vec_IntEntry(vEdges,pDVar12->index);
      local_3c = (Dec_Edge_t)(uVar9 & 0x7fffffff);
      uVar10 = Vec_IntEntry(vEdges,*(int *)((ulong)n_01 & 0xfffffffffffffffe));
      uVar15 = Vec_IntEntry(vEdges,*(int *)((ulong)n_00 & 0xfffffffffffffffe));
      uVar16 = ((uint)n_01 ^ uVar10) & 1;
      local_7c = (Dec_Edge_t)(uVar10 & 0x7ffffffe | uVar16);
      uVar19 = ((uint)n_00 ^ uVar15) & 1;
      local_88 = (Abc_Obj_t *)CONCAT44(local_88._4_4_,uVar15 & 0x7ffffffe | uVar19);
      local_98 = (Abc_Obj_t *)n_01;
      Cudd_RecursiveDeref(pManRst->dd,n_00);
      DVar11 = local_3c;
      Cudd_RecursiveDeref(pManRst->dd,(DdNode *)local_98);
      DVar8 = local_7c;
      pDVar3 = pGraph->pNodes;
      local_58 = (ulong)((uint)DVar11 >> 1) * 0x18;
      uVar21 = (ulong)(uVar10 >> 1 & 0x3fffffff);
      local_60 = uVar21 * 0x18;
      uVar17 = (ulong)(uVar15 >> 1 & 0x3fffffff);
      local_38 = uVar17 * 0x18;
      local_98 = (Abc_Obj_t *)((ulong)(uVar9 & 1) ^ (ulong)pDVar3[(uint)DVar11 >> 1].field_2.pFunc);
      if (pDVar3[(uint)DVar11 >> 1].field_2.pFunc == (void *)0x0) {
        local_98 = (Abc_Obj_t *)0x0;
      }
      local_68 = (Abc_Obj_t *)((ulong)uVar16 ^ (ulong)pDVar3[uVar21].field_2.pFunc);
      if (pDVar3[uVar21].field_2.pFunc == (void *)0x0) {
        local_68 = (Abc_Obj_t *)0x0;
      }
      local_78 = (Abc_Obj_t *)((ulong)uVar19 ^ (ulong)pDVar3[uVar17].field_2.pFunc);
      if (pDVar3[uVar17].field_2.pFunc == (void *)0x0) {
        local_78 = (Abc_Obj_t *)0x0;
      }
      Type = 0;
      bVar22 = local_98 == (Abc_Obj_t *)0x0;
      bVar23 = local_68 == (Abc_Obj_t *)0x0;
      pAVar13 = (Abc_Obj_t *)0x0;
      if (((bVar23 || bVar22) || (local_78 == (Abc_Obj_t *)0x0)) ||
         (pAVar13 = Abc_AigMuxLookup((Abc_Aig_t *)pManRst->pNtk->pManFunc,local_98,local_68,local_78
                                     ,&Type), Type == 0)) {
        DVar8 = Dec_GraphAddNodeAnd(pGraph,DVar11,DVar8);
        DVar11 = Dec_GraphAddNodeAnd(pGraph,(Dec_Edge_t)((uint)DVar11 ^ 1),local_88._0_4_);
        DVar8 = Dec_GraphAddNodeOr(pGraph,DVar8,DVar11);
      }
      else {
        DVar20 = (Dec_Edge_t)((uint)local_88._0_4_ ^ 1);
        DVar8 = Dec_GraphAddNodeAnd(pGraph,DVar11,(Dec_Edge_t)((uint)DVar8 ^ 1));
        DVar11 = Dec_GraphAddNodeAnd(pGraph,(Dec_Edge_t)((uint)DVar11 ^ 1),DVar20);
        DVar8 = Dec_GraphAddNodeOr(pGraph,DVar8,DVar11);
        DVar8 = (Dec_Edge_t)((uint)DVar8 ^ 1);
      }
      vEdges = local_48;
      pDVar3 = pGraph->pNodes;
      uVar10 = *(uint *)(&pDVar3->field_0x10 + local_58) & 0x3fff;
      uVar9 = *(uint *)(&pDVar3->field_0x10 + local_60) & 0x3fff;
      uVar15 = *(uint *)(&pDVar3->field_0x10 + local_38) & 0x3fff;
      if (uVar9 < uVar10) {
        uVar9 = uVar10;
      }
      if (uVar9 <= uVar15) {
        uVar9 = uVar15;
      }
      uVar10 = (uint)DVar8 >> 1;
      *(uint *)&pDVar3[uVar10].field_0x10 =
           *(uint *)&pDVar3[uVar10].field_0x10 & 0xffffc000 | uVar9 + 2 & 0x3fff;
      if (pAVar13 != (Abc_Obj_t *)0x0) {
        pGraph->pNodes[uVar10].field_2.pFunc = (void *)((ulong)((uint)DVar8 & 1) ^ (ulong)pAVar13);
        if ((local_8c != 1000000000) &&
           ((*(uint *)&pGraph->pNodes[uVar10].field_0x10 & 0x3fff) !=
            *(uint *)(((ulong)pAVar13 & 0xfffffffffffffffe) + 0x14) >> 0xc)) {
          __assert_fail("Required == ABC_INFINITY || Level4 == (int)Abc_ObjRegular(pNode4)->Level",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcRestruct.c"
                        ,0x346,
                        "Dec_Edge_t Abc_NodeEvaluateDsd_rec(Dec_Graph_t *, Abc_ManRst_t *, Dsd_Node_t *, int, int, int *)"
                       );
        }
        iVar6 = Abc_NodeIsTravIdCurrent((Abc_Obj_t *)((ulong)pAVar13 & 0xfffffffffffffffe));
        if (iVar6 == 0) goto LAB_0027482b;
      }
      piVar4 = local_50;
      iVar7 = local_90;
      pAVar13 = local_98;
      iVar6 = *local_50;
      *local_50 = iVar6 + 1;
      if (Type == 0) {
        if (bVar23 || bVar22) {
          iVar6 = iVar6 + 2;
LAB_00274d95:
          *piVar4 = iVar6;
        }
        else {
          pAVar14 = Abc_AigAndLookup((Abc_Aig_t *)pManRst->pNtk->pManFunc,local_98,local_68);
          if ((pAVar14 == (Abc_Obj_t *)0x0) ||
             (iVar6 = Abc_NodeIsTravIdCurrent((Abc_Obj_t *)((ulong)pAVar14 & 0xfffffffffffffffe)),
             iVar6 != 0)) {
            iVar6 = *piVar4 + 1;
            goto LAB_00274d95;
          }
        }
        if ((pAVar13 != (Abc_Obj_t *)0x0) && (local_78 != (Abc_Obj_t *)0x0)) {
          pAVar18 = (Abc_Aig_t *)pManRst->pNtk->pManFunc;
          pAVar14 = local_78;
          goto LAB_00274dbf;
        }
LAB_00274dd9:
        *piVar4 = *piVar4 + 1;
      }
      else {
        if (bVar23 || bVar22) {
          iVar6 = iVar6 + 2;
LAB_00274d5d:
          *piVar4 = iVar6;
        }
        else {
          pAVar14 = Abc_AigAndLookup((Abc_Aig_t *)pManRst->pNtk->pManFunc,local_98,
                                     (Abc_Obj_t *)((ulong)local_68 ^ 1));
          if ((pAVar14 == (Abc_Obj_t *)0x0) ||
             (iVar6 = Abc_NodeIsTravIdCurrent((Abc_Obj_t *)((ulong)pAVar14 & 0xfffffffffffffffe)),
             iVar6 != 0)) {
            iVar6 = *piVar4 + 1;
            goto LAB_00274d5d;
          }
        }
        if ((pAVar13 == (Abc_Obj_t *)0x0) || (local_78 == (Abc_Obj_t *)0x0)) goto LAB_00274dd9;
        pAVar18 = (Abc_Aig_t *)pManRst->pNtk->pManFunc;
        pAVar14 = (Abc_Obj_t *)((ulong)local_78 ^ 1);
LAB_00274dbf:
        pAVar13 = Abc_AigAndLookup(pAVar18,(Abc_Obj_t *)((ulong)pAVar13 ^ 1),pAVar14);
        if ((pAVar13 == (Abc_Obj_t *)0x0) ||
           (iVar6 = Abc_NodeIsTravIdCurrent((Abc_Obj_t *)((ulong)pAVar13 & 0xfffffffffffffffe)),
           iVar6 != 0)) goto LAB_00274dd9;
      }
      if (iVar7 < *piVar4) {
LAB_00274de6:
        Vec_IntFree(vEdges);
        return (Dec_Edge_t)0xfac;
      }
      goto LAB_0027482b;
    }
    iVar6 = vEdges->nSize;
    if (iVar6 < 2) {
      __assert_fail("Vec_IntSize(vEdges) > 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcRestruct.c"
                    ,0x27e,
                    "Dec_Edge_t Abc_NodeEvaluateDsd_rec(Dec_Graph_t *, Abc_ManRst_t *, Dsd_Node_t *, int, int, int *)"
                   );
    }
    while (1 < iVar6) {
      if (iVar6 != 2) {
        Abc_NodeEdgeDsdPermute(pGraph,pManRst,vEdges,0);
      }
      uVar9 = Vec_IntPop(vEdges);
      uVar10 = Vec_IntPop(vEdges);
      uVar15 = (uVar9 & 0x7fffffff) >> 1;
      pvVar1 = pGraph->pNodes[uVar15].field_2.pFunc;
      uVar16 = (uVar10 & 0x7fffffff) >> 1;
      pvVar2 = pGraph->pNodes[uVar16].field_2.pFunc;
      uVar21 = (ulong)(uVar9 & 1) ^ (ulong)pvVar1;
      if (pvVar1 == (void *)0x0) {
        uVar21 = 0;
      }
      if ((pvVar2 == (void *)0x0) || (uVar21 == 0)) {
LAB_00274431:
        uVar17 = 0;
      }
      else {
        uVar17 = 0;
        if ((void *)(ulong)(uVar10 & 1) != pvVar2) {
          pAVar13 = Abc_AigAndLookup((Abc_Aig_t *)pManRst->pNtk->pManFunc,(Abc_Obj_t *)(uVar21 ^ 1),
                                     (Abc_Obj_t *)((ulong)(uVar10 & 1) ^ (ulong)pvVar2 ^ 1));
          if (pAVar13 == (Abc_Obj_t *)0x0) goto LAB_00274431;
          uVar17 = (ulong)pAVar13 ^ 1;
        }
      }
      DVar8 = Dec_GraphAddNodeOr(pGraph,(Dec_Edge_t)(uVar9 & 0x7fffffff),
                                 (Dec_Edge_t)(uVar10 & 0x7fffffff));
      vEdges = local_48;
      piVar4 = local_50;
      iVar6 = local_90;
      pDVar3 = pGraph->pNodes;
      uVar10 = *(uint *)&pDVar3[uVar15].field_0x10 & 0x3fff;
      uVar9 = *(uint *)&pDVar3[uVar16].field_0x10 & 0x3fff;
      if (uVar9 < uVar10) {
        uVar9 = uVar10;
      }
      uVar10 = (uint)DVar8 >> 1;
      *(uint *)&pDVar3[uVar10].field_0x10 =
           *(uint *)&pDVar3[uVar10].field_0x10 & 0xffffc000 | uVar9 + 1 & 0x3fff;
      if (uVar17 == 0) {
LAB_002744eb:
        iVar7 = *piVar4;
        *piVar4 = iVar7 + 1;
        if (iVar6 <= iVar7) goto LAB_00274de6;
      }
      else {
        pGraph->pNodes[uVar10].field_2.pFunc = (void *)((uint)DVar8 & 1 ^ uVar17);
        if ((local_8c != 1000000000) &&
           ((*(uint *)&pGraph->pNodes[uVar10].field_0x10 & 0x3fff) !=
            *(uint *)((uVar17 & 0xfffffffffffffffe) + 0x14) >> 0xc)) {
          __assert_fail("Required == ABC_INFINITY || Level3 == (int)Abc_ObjRegular(pNode3)->Level",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcRestruct.c"
                        ,0x29d,
                        "Dec_Edge_t Abc_NodeEvaluateDsd_rec(Dec_Graph_t *, Abc_ManRst_t *, Dsd_Node_t *, int, int, int *)"
                       );
        }
        iVar7 = Abc_NodeIsTravIdCurrent((Abc_Obj_t *)(uVar17 & 0xfffffffffffffffe));
        if (iVar7 != 0) goto LAB_002744eb;
      }
      Abc_NodeEdgeDsdPushOrdered(pGraph,vEdges,(int)DVar8);
      iVar6 = vEdges->nSize;
    }
  }
  DVar8 = (Dec_Edge_t)Vec_IntPop(vEdges);
LAB_0027482b:
  Vec_IntFree(vEdges);
  return (Dec_Edge_t)((uint)DVar8 & 0x7ffffffe | ((uint)DVar8 ^ (uint)local_70) & 1);
}

Assistant:

Dec_Edge_t Abc_NodeEvaluateDsd_rec( Dec_Graph_t * pGraph, Abc_ManRst_t * pManRst, Dsd_Node_t * pNodeDsd, int Required, int nNodesSaved, int * pnNodesAdded )
{
    Dec_Edge_t eNode1, eNode2, eNode3, eResult, eQuit = { 0, 2006 };
    Abc_Obj_t * pNode1, * pNode2, * pNode3, * pNode4, * pTemp;
    Dsd_Node_t * pChildDsd;
    Dsd_Type_t DecType;
    Vec_Int_t * vEdges;
    int Level1, Level2, Level3, Level4;
    int i, Index, fCompl, Type;

    // remove the complemented attribute
    fCompl   = Dsd_IsComplement( pNodeDsd );
    pNodeDsd = Dsd_Regular( pNodeDsd );

    // consider the trivial case
    DecType = Dsd_NodeReadType( pNodeDsd );
    if ( DecType == DSD_NODE_BUF )
    {
        Index = Dsd_NodeReadFunc(pNodeDsd)->index;
        assert( Index < Dec_GraphLeaveNum(pGraph) );
        eResult = Dec_EdgeCreate( Index, fCompl );
        return eResult;
    }
    assert( DecType == DSD_NODE_OR || DecType == DSD_NODE_EXOR || DecType == DSD_NODE_PRIME );

    // solve the problem for the children
    vEdges = Vec_IntAlloc( Dsd_NodeReadDecsNum(pNodeDsd) );
    Dsd_NodeForEachChild( pNodeDsd, i, pChildDsd )
    {
        eResult = Abc_NodeEvaluateDsd_rec( pGraph, pManRst, pChildDsd, Required, nNodesSaved, pnNodesAdded );
        if ( eResult.Node == eQuit.Node ) // infeasible
        {
            Vec_IntFree( vEdges );
            return eQuit;
        }
        // order the inputs only if this is OR or EXOR
        if ( DecType == DSD_NODE_PRIME )
            Vec_IntPush( vEdges, Dec_EdgeToInt(eResult) );
        else
            Abc_NodeEdgeDsdPushOrdered( pGraph, vEdges, Dec_EdgeToInt(eResult) );
    }
    // the edges are sorted by the level of their nodes in decreasing order


    // consider special cases
    if ( DecType == DSD_NODE_OR )
    {
        // try to balance the nodes by delay
        assert( Vec_IntSize(vEdges) > 1 );
        while ( Vec_IntSize(vEdges) > 1 )
        {
            // permute the last two entries
            if ( Vec_IntSize(vEdges) > 2 )
                Abc_NodeEdgeDsdPermute( pGraph, pManRst, vEdges, 0 );
            // get the two last nodes
            eNode1 = Dec_IntToEdge( Vec_IntPop(vEdges) );
            eNode2 = Dec_IntToEdge( Vec_IntPop(vEdges) );
            pNode1 = (Abc_Obj_t *)Dec_GraphNode( pGraph, eNode1.Node )->pFunc;
            pNode2 = (Abc_Obj_t *)Dec_GraphNode( pGraph, eNode2.Node )->pFunc;
            pNode1 = !pNode1? NULL : Abc_ObjNotCond( pNode1, eNode1.fCompl );
            pNode2 = !pNode2? NULL : Abc_ObjNotCond( pNode2, eNode2.fCompl );
            // check if the new node exists
            pNode3 = NULL;
            if ( pNode1 && pNode2 )
            {
                pNode3 = Abc_AigAndLookup( (Abc_Aig_t *)pManRst->pNtk->pManFunc, Abc_ObjNot(pNode1), Abc_ObjNot(pNode2) ); 
                pNode3 = !pNode3? NULL : Abc_ObjNot(pNode3);
            }
            // create the new node
            eNode3 = Dec_GraphAddNodeOr( pGraph, eNode1, eNode2 );
            // set level
            Level1 = Dec_GraphNode( pGraph, eNode1.Node )->Level;
            Level2 = Dec_GraphNode( pGraph, eNode2.Node )->Level;
            Dec_GraphNode( pGraph, eNode3.Node )->Level = 1 + Abc_MaxInt(Level1, Level2);
            // get the new node if possible
            if ( pNode3 )
            {
                Dec_GraphNode( pGraph, eNode3.Node )->pFunc = Abc_ObjNotCond(pNode3, eNode3.fCompl);
                Level3 = Dec_GraphNode( pGraph, eNode3.Node )->Level;
                assert( Required == ABC_INFINITY || Level3 == (int)Abc_ObjRegular(pNode3)->Level );
            }
            if ( !pNode3 || Abc_NodeIsTravIdCurrent(Abc_ObjRegular(pNode3)) )
            {
                (*pnNodesAdded)++;
                if ( *pnNodesAdded > nNodesSaved )
                {
                    Vec_IntFree( vEdges );
                    return eQuit;
                }
            }
            // add the resulting node to the form
            Abc_NodeEdgeDsdPushOrdered( pGraph, vEdges, Dec_EdgeToInt(eNode3) );
        }
        // get the last node
        eResult = Dec_IntToEdge( Vec_IntPop(vEdges) );
        Vec_IntFree( vEdges );
        // complement the graph if the node was complemented
        eResult.fCompl ^= fCompl;
        return eResult;
    }
    if ( DecType == DSD_NODE_EXOR )
    {
        // try to balance the nodes by delay
        assert( Vec_IntSize(vEdges) > 1 );
        while ( Vec_IntSize(vEdges) > 1 )
        {
            // permute the last two entries
            if ( Vec_IntSize(vEdges) > 2 )
                Abc_NodeEdgeDsdPermute( pGraph, pManRst, vEdges, 1 );
            // get the two last nodes
            eNode1 = Dec_IntToEdge( Vec_IntPop(vEdges) );
            eNode2 = Dec_IntToEdge( Vec_IntPop(vEdges) );
            pNode1 = (Abc_Obj_t *)Dec_GraphNode( pGraph, eNode1.Node )->pFunc;
            pNode2 = (Abc_Obj_t *)Dec_GraphNode( pGraph, eNode2.Node )->pFunc;
            pNode1 = !pNode1? NULL : Abc_ObjNotCond( pNode1, eNode1.fCompl );
            pNode2 = !pNode2? NULL : Abc_ObjNotCond( pNode2, eNode2.fCompl );
            // check if the new node exists
            Type = 0;
            pNode3 = NULL;
            if ( pNode1 && pNode2 )
                pNode3 = Abc_AigXorLookup( (Abc_Aig_t *)pManRst->pNtk->pManFunc, pNode1, pNode2, &Type ); 
            // create the new node
            eNode3 = Dec_GraphAddNodeXor( pGraph, eNode1, eNode2, Type ); // should have the same structure as in AIG
            // set level
            Level1 = Dec_GraphNode( pGraph, eNode1.Node )->Level;
            Level2 = Dec_GraphNode( pGraph, eNode2.Node )->Level;
            Dec_GraphNode( pGraph, eNode3.Node )->Level = 2 + Abc_MaxInt(Level1, Level2);
            // get the new node if possible
            if ( pNode3 )
            {
                Dec_GraphNode( pGraph, eNode3.Node )->pFunc = Abc_ObjNotCond(pNode3, eNode3.fCompl);
                Level3 = Dec_GraphNode( pGraph, eNode3.Node )->Level;
                assert( Required == ABC_INFINITY || Level3 == (int)Abc_ObjRegular(pNode3)->Level );
            }
            if ( !pNode3 || Abc_NodeIsTravIdCurrent(Abc_ObjRegular(pNode3)) )
            {
                (*pnNodesAdded)++;
                if ( !pNode1 || !pNode2 )
                    (*pnNodesAdded) += 2;
                else if ( Type == 0 )
                {
                    pTemp = Abc_AigAndLookup( (Abc_Aig_t *)pManRst->pNtk->pManFunc, pNode1, Abc_ObjNot(pNode2) );
                    if ( !pTemp || Abc_NodeIsTravIdCurrent(Abc_ObjRegular(pTemp)) )
                        (*pnNodesAdded)++;
                    pTemp = Abc_AigAndLookup( (Abc_Aig_t *)pManRst->pNtk->pManFunc, Abc_ObjNot(pNode1), pNode2 );
                    if ( !pTemp || Abc_NodeIsTravIdCurrent(Abc_ObjRegular(pTemp)) )
                        (*pnNodesAdded)++;
                }
                else
                {
                    pTemp = Abc_AigAndLookup( (Abc_Aig_t *)pManRst->pNtk->pManFunc, Abc_ObjNot(pNode1), Abc_ObjNot(pNode2) );
                    if ( !pTemp || Abc_NodeIsTravIdCurrent(Abc_ObjRegular(pTemp)) )
                        (*pnNodesAdded)++;
                    pTemp = Abc_AigAndLookup( (Abc_Aig_t *)pManRst->pNtk->pManFunc, pNode1, pNode2 );
                    if ( !pTemp || Abc_NodeIsTravIdCurrent(Abc_ObjRegular(pTemp)) )
                        (*pnNodesAdded)++;
                }
                if ( *pnNodesAdded > nNodesSaved )
                {
                    Vec_IntFree( vEdges );
                    return eQuit;
                }
            }
            // add the resulting node to the form
            Abc_NodeEdgeDsdPushOrdered( pGraph, vEdges, Dec_EdgeToInt(eNode3) );
        }
        // get the last node
        eResult = Dec_IntToEdge( Vec_IntPop(vEdges) );
        Vec_IntFree( vEdges );
        // complement the graph if the node is complemented
        eResult.fCompl ^= fCompl;
        return eResult;
    }
    if ( DecType == DSD_NODE_PRIME )
    {
        DdNode * bLocal, * bVar, * bCofT, * bCofE;
        bLocal = Dsd_TreeGetPrimeFunction( pManRst->dd, pNodeDsd );  Cudd_Ref( bLocal );
//Extra_bddPrint( pManRst->dd, bLocal );

        bVar  = pManRst->dd->vars[0];
        bCofE = Cudd_Cofactor( pManRst->dd, bLocal, Cudd_Not(bVar) );  Cudd_Ref( bCofE );
        bCofT = Cudd_Cofactor( pManRst->dd, bLocal, bVar );            Cudd_Ref( bCofT );
        if ( !Extra_bddIsVar(bCofE) || !Extra_bddIsVar(bCofT) )
        {
            Cudd_RecursiveDeref( pManRst->dd, bCofE );
            Cudd_RecursiveDeref( pManRst->dd, bCofT );
            bVar  = pManRst->dd->vars[1];
            bCofE = Cudd_Cofactor( pManRst->dd, bLocal, Cudd_Not(bVar) );  Cudd_Ref( bCofE );
            bCofT = Cudd_Cofactor( pManRst->dd, bLocal, bVar );            Cudd_Ref( bCofT );
            if ( !Extra_bddIsVar(bCofE) || !Extra_bddIsVar(bCofT) )
            {
                Cudd_RecursiveDeref( pManRst->dd, bCofE );
                Cudd_RecursiveDeref( pManRst->dd, bCofT );
                bVar  = pManRst->dd->vars[2];
                bCofE = Cudd_Cofactor( pManRst->dd, bLocal, Cudd_Not(bVar) );  Cudd_Ref( bCofE );
                bCofT = Cudd_Cofactor( pManRst->dd, bLocal, bVar );            Cudd_Ref( bCofT );
                if ( !Extra_bddIsVar(bCofE) || !Extra_bddIsVar(bCofT) )
                {
                    Cudd_RecursiveDeref( pManRst->dd, bCofE );
                    Cudd_RecursiveDeref( pManRst->dd, bCofT );
                    Cudd_RecursiveDeref( pManRst->dd, bLocal );
                    Vec_IntFree( vEdges );
                    return eQuit;
                }
            }
        }
        Cudd_RecursiveDeref( pManRst->dd, bLocal );
        // we found the control variable (bVar) and the var-cofactors (bCofT, bCofE)

        // find the graph nodes
        eNode1 = Dec_IntToEdge( Vec_IntEntry(vEdges, bVar->index) );
        eNode2 = Dec_IntToEdge( Vec_IntEntry(vEdges, Cudd_Regular(bCofT)->index) );
        eNode3 = Dec_IntToEdge( Vec_IntEntry(vEdges, Cudd_Regular(bCofE)->index) );
        // add the complements to the graph nodes
        eNode2.fCompl ^= Cudd_IsComplement(bCofT);
        eNode3.fCompl ^= Cudd_IsComplement(bCofE);

        // because the cofactors are vars, we can just as well deref them here
        Cudd_RecursiveDeref( pManRst->dd, bCofE );
        Cudd_RecursiveDeref( pManRst->dd, bCofT );

        // find the ABC nodes
        pNode1 = (Abc_Obj_t *)Dec_GraphNode( pGraph, eNode1.Node )->pFunc;
        pNode2 = (Abc_Obj_t *)Dec_GraphNode( pGraph, eNode2.Node )->pFunc;
        pNode3 = (Abc_Obj_t *)Dec_GraphNode( pGraph, eNode3.Node )->pFunc;
        pNode1 = !pNode1? NULL : Abc_ObjNotCond( pNode1, eNode1.fCompl );
        pNode2 = !pNode2? NULL : Abc_ObjNotCond( pNode2, eNode2.fCompl );
        pNode3 = !pNode3? NULL : Abc_ObjNotCond( pNode3, eNode3.fCompl );

        // check if the new node exists
        Type = 0;
        pNode4 = NULL;
        if ( pNode1 && pNode2 && pNode3 )
            pNode4 = Abc_AigMuxLookup( (Abc_Aig_t *)pManRst->pNtk->pManFunc, pNode1, pNode2, pNode3, &Type ); 

        // create the new node
        eResult = Dec_GraphAddNodeMux( pGraph, eNode1, eNode2, eNode3, Type ); // should have the same structure as AIG

        // set level
        Level1 = Dec_GraphNode( pGraph, eNode1.Node )->Level;
        Level2 = Dec_GraphNode( pGraph, eNode2.Node )->Level;
        Level3 = Dec_GraphNode( pGraph, eNode3.Node )->Level;
        Dec_GraphNode( pGraph, eResult.Node )->Level = 2 + Abc_MaxInt( Abc_MaxInt(Level1, Level2), Level3 );
        // get the new node if possible
        if ( pNode4 )
        {
            Dec_GraphNode( pGraph, eResult.Node )->pFunc = Abc_ObjNotCond(pNode4, eResult.fCompl);
            Level4 = Dec_GraphNode( pGraph, eResult.Node )->Level;
            assert( Required == ABC_INFINITY || Level4 == (int)Abc_ObjRegular(pNode4)->Level );
        }
        if ( !pNode4 || Abc_NodeIsTravIdCurrent(Abc_ObjRegular(pNode4)) )
        {
            (*pnNodesAdded)++;
            if ( Type == 0 ) 
            {
                if ( !pNode1 || !pNode2 )
                    (*pnNodesAdded)++;
                else
                {
                    pTemp = Abc_AigAndLookup( (Abc_Aig_t *)pManRst->pNtk->pManFunc, pNode1, pNode2 );
                    if ( !pTemp || Abc_NodeIsTravIdCurrent(Abc_ObjRegular(pTemp)) )
                        (*pnNodesAdded)++;
                }
                if ( !pNode1 || !pNode3 )
                    (*pnNodesAdded)++;
                else
                {
                    pTemp = Abc_AigAndLookup( (Abc_Aig_t *)pManRst->pNtk->pManFunc, Abc_ObjNot(pNode1), pNode3 );
                    if ( !pTemp || Abc_NodeIsTravIdCurrent(Abc_ObjRegular(pTemp)) )
                        (*pnNodesAdded)++;
                }
            }
            else
            {
                if ( !pNode1 || !pNode2 )
                    (*pnNodesAdded)++;
                else
                {
                    pTemp = Abc_AigAndLookup( (Abc_Aig_t *)pManRst->pNtk->pManFunc, pNode1, Abc_ObjNot(pNode2) );
                    if ( !pTemp || Abc_NodeIsTravIdCurrent(Abc_ObjRegular(pTemp)) )
                        (*pnNodesAdded)++;
                }
                if ( !pNode1 || !pNode3 )
                    (*pnNodesAdded)++;
                else
                {
                    pTemp = Abc_AigAndLookup( (Abc_Aig_t *)pManRst->pNtk->pManFunc, Abc_ObjNot(pNode1), Abc_ObjNot(pNode3) );
                    if ( !pTemp || Abc_NodeIsTravIdCurrent(Abc_ObjRegular(pTemp)) )
                        (*pnNodesAdded)++;
                }
            }
            if ( *pnNodesAdded > nNodesSaved )
            {
                Vec_IntFree( vEdges );
                return eQuit;
            }
        }

        Vec_IntFree( vEdges );
        // complement the graph if the node was complemented
        eResult.fCompl ^= fCompl;
        return eResult;
    }
    Vec_IntFree( vEdges );
    return eQuit;
}